

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O0

void Bdc_ManPrepare(Bdc_Man_t *p,Vec_Ptr_t *vDivs)

{
  int iVar1;
  uint uVar2;
  Bdc_Fun_t *pBVar3;
  uint *puVar4;
  int local_34;
  int local_2c;
  int i;
  Bdc_Fun_t *pNode;
  uint *puTruth;
  Vec_Ptr_t *vDivs_local;
  Bdc_Man_t *p_local;
  
  Bdc_TableClear(p);
  Vec_IntClear(p->vMemory);
  p->nNodes = 0;
  iVar1 = p->nVars;
  if (vDivs == (Vec_Ptr_t *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = Vec_PtrSize(vDivs);
  }
  p->nNodesNew = (-1 - iVar1) - local_34;
  pBVar3 = Bdc_FunNew(p);
  pBVar3->Type = 1;
  puVar4 = Vec_IntFetch(p->vMemory,p->nWords);
  pBVar3->puFunc = puVar4;
  Kit_TruthFill(pBVar3->puFunc,p->nVars);
  pBVar3->uSupp = 0;
  Bdc_TableAdd(p,pBVar3);
  for (local_2c = 0; local_2c < p->nVars; local_2c = local_2c + 1) {
    pBVar3 = Bdc_FunNew(p);
    pBVar3->Type = 2;
    puVar4 = (uint *)Vec_PtrEntry(p->vTruths,local_2c);
    pBVar3->puFunc = puVar4;
    pBVar3->uSupp = 1 << ((byte)local_2c & 0x1f);
    Bdc_TableAdd(p,pBVar3);
  }
  if (vDivs != (Vec_Ptr_t *)0x0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(vDivs), local_2c < iVar1; local_2c = local_2c + 1) {
      puVar4 = (uint *)Vec_PtrEntry(vDivs,local_2c);
      pBVar3 = Bdc_FunNew(p);
      pBVar3->Type = 2;
      pBVar3->puFunc = puVar4;
      uVar2 = Kit_TruthSupport(puVar4,p->nVars);
      pBVar3->uSupp = uVar2;
      Bdc_TableAdd(p,pBVar3);
      if (local_2c == p->nDivsLimit) break;
    }
  }
  if (p->nNodesNew == 0) {
    return;
  }
  __assert_fail("p->nNodesNew == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcCore.c"
                ,0xb9,"void Bdc_ManPrepare(Bdc_Man_t *, Vec_Ptr_t *)");
}

Assistant:

void Bdc_ManPrepare( Bdc_Man_t * p, Vec_Ptr_t * vDivs )
{
    unsigned * puTruth;
    Bdc_Fun_t * pNode;
    int i;
    Bdc_TableClear( p );
    Vec_IntClear( p->vMemory );
    // add constant 1 and elementary vars
    p->nNodes = 0;
    p->nNodesNew = - 1 - p->nVars - (vDivs? Vec_PtrSize(vDivs) : 0);
    // add constant 1
    pNode = Bdc_FunNew( p );
    pNode->Type = BDC_TYPE_CONST1;
    pNode->puFunc = (unsigned *)Vec_IntFetch(p->vMemory, p->nWords); 
    Kit_TruthFill( pNode->puFunc, p->nVars );
    pNode->uSupp = 0;
    Bdc_TableAdd( p, pNode );
    // add variables
    for ( i = 0; i < p->nVars; i++ )
    {
        pNode = Bdc_FunNew( p );
        pNode->Type = BDC_TYPE_PI;
        pNode->puFunc = (unsigned *)Vec_PtrEntry( p->vTruths, i );
        pNode->uSupp = (1 << i);
        Bdc_TableAdd( p, pNode );
    }
    // add the divisors
    if ( vDivs )
    Vec_PtrForEachEntry( unsigned *, vDivs, puTruth, i )
    {
        pNode = Bdc_FunNew( p );
        pNode->Type = BDC_TYPE_PI;
        pNode->puFunc = puTruth;
        pNode->uSupp = Kit_TruthSupport( puTruth, p->nVars );
        Bdc_TableAdd( p, pNode );
        if ( i == p->nDivsLimit )
            break;
    }
    assert( p->nNodesNew == 0 );
}